

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O0

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::avx512bw>::weight_stadium
          (PolarExtentCoreSimd<xsimd::avx512bw> *this,PolarExtentCoreContext *ctx,
          PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> *position)

{
  batch sin_angle;
  batch cos_angle;
  bool bVar1;
  batch *pbVar2;
  long in_RSI;
  batch<float,_xsimd::avx512bw> *in_RDI;
  undefined8 uVar3;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  simd_register<float,_xsimd::avx512f> sVar4;
  undefined8 uVar12;
  undefined1 auVar5 [64];
  batch circle_val;
  batch<float,_xsimd::avx512bw> circle_dot;
  batch straight_val;
  batch_bool<float,_xsimd::avx512bw> in_straight_line_part;
  batch<float,_xsimd::avx512bw> circle_test_dot;
  PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> position_t_right;
  PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> position_t;
  batch<float,_xsimd::avx512bw> *in_stack_fffffffffffff9a0;
  batch<float,_xsimd::avx512bw> *z;
  batch<float,_xsimd::avx512bw> *in_stack_fffffffffffff9a8;
  batch<float,_xsimd::avx512bw> *y;
  undefined1 local_640 [64];
  undefined1 local_600 [28];
  float val;
  batch<float,_xsimd::avx512bw> *in_stack_fffffffffffffa20;
  batch<float,_xsimd::avx512bw> *in_stack_fffffffffffffa28;
  batch<float,_xsimd::avx512bw> *in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa80 [64];
  undefined1 local_500 [64];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  batch<float,_xsimd::avx512bw> local_440;
  get_bool_simd_register_t<float,_xsimd::avx512bw> local_3c2 [21];
  PolarExtentCoreContext *in_stack_fffffffffffffc68;
  PolarExtentCoreSimd<xsimd::avx512bw> *in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  undefined1 auVar13 [56];
  batch<float,_xsimd::avx512bw> local_300;
  undefined1 local_2c0 [64];
  batch<float,_xsimd::avx512bw> local_280;
  batch<float,_xsimd::avx512bw> abStack_240 [2];
  undefined1 local_1c0 [240];
  long local_d0;
  undefined1 local_c0 [184];
  
  val = (float)((ulong)stack0xfffffffffffffa18 >> 0x20);
  local_d0 = in_RSI;
  PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_>::transform
            (in_stack_fffffffffffffa80._32_8_,in_stack_fffffffffffffa80._24_8_);
  memcpy(&local_280,local_1c0,0xc0);
  xsimd::abs<float,xsimd::avx512bw>(in_RDI);
  memcpy(&local_280,local_2c0,0x40);
  xsimd::batch<float,_xsimd::avx512bw>::batch(in_stack_fffffffffffffa20,val);
  sVar4.data = (register_type)ZEXT464(*(uint *)(local_d0 + 0x6c));
  xsimd::batch<float,_xsimd::avx512bw>::batch(in_stack_fffffffffffffa20,val);
  xsimd::operator*(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  auVar13 = sVar4.data._0_56_;
  xsimd::fma<float,xsimd::avx512bw>(in_RDI,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
  uVar3 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  uVar12 = 0;
  local_300.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data =
       (simd_register<float,_xsimd::avx512bw>)(simd_register<float,_xsimd::avx512bw>)sVar4.data;
  xsimd::batch<float,_xsimd::avx512bw>::batch(in_stack_fffffffffffffa20,val);
  local_3c2[0].data = (register_type)xsimd::operator>=(&local_300,&local_440);
  xsimd::abs<float,xsimd::avx512bw>(in_RDI);
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[2] =
       (float)auVar13._0_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[3] =
       (float)auVar13._4_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[4] =
       (float)auVar13._8_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[5] =
       (float)auVar13._12_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[6] =
       (float)auVar13._16_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[7] =
       (float)auVar13._20_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[8] =
       (float)auVar13._24_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[9] =
       (float)auVar13._28_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[10] =
       (float)auVar13._32_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xb] =
       (float)auVar13._36_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xc] =
       (float)auVar13._40_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xd] =
       (float)auVar13._44_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xe] =
       (float)auVar13._48_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xf] =
       (float)auVar13._52_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0] =
       (float)(int)in_stack_fffffffffffffc78;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[1] =
       (float)(int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  local_4c0 = uVar3;
  uStack_4b8 = uVar6;
  uStack_4b0 = uVar7;
  uStack_4a8 = uVar8;
  uStack_4a0 = uVar9;
  uStack_498 = uVar10;
  uStack_490 = uVar11;
  uStack_488 = uVar12;
  weight_from_sin(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,sin_angle);
  y = &local_280;
  local_480 = uVar3;
  uStack_478 = uVar6;
  uStack_470 = uVar7;
  uStack_468 = uVar8;
  uStack_460 = uVar9;
  uStack_458 = uVar10;
  uStack_450 = uVar11;
  uStack_448 = uVar12;
  xsimd::batch<float,_xsimd::avx512bw>::batch(in_stack_fffffffffffffa20,val);
  z = abStack_240;
  auVar5 = ZEXT464(*(uint *)(local_d0 + 0x74));
  xsimd::batch<float,_xsimd::avx512bw>::batch(in_stack_fffffffffffffa20,val);
  xsimd::operator*(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  xsimd::fma<float,xsimd::avx512bw>(in_RDI,y,z);
  local_500 = auVar5;
  memcpy(local_640,local_500,0x40);
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[2] =
       (float)auVar13._0_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[3] =
       (float)auVar13._4_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[4] =
       (float)auVar13._8_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[5] =
       (float)auVar13._12_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[6] =
       (float)auVar13._16_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[7] =
       (float)auVar13._20_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[8] =
       (float)auVar13._24_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[9] =
       (float)auVar13._28_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[10] =
       (float)auVar13._32_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xb] =
       (float)auVar13._36_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xc] =
       (float)auVar13._40_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xd] =
       (float)auVar13._44_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xe] =
       (float)auVar13._48_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xf] =
       (float)auVar13._52_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0] =
       (float)(int)in_stack_fffffffffffffc78;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[1] =
       (float)(int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  weight_from_cos(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,cos_angle);
  bVar1 = xsimd::all<float,xsimd::avx512bw>((batch_bool<float,_xsimd::avx512bw> *)local_3c2);
  if (bVar1) {
    pbVar2 = (batch *)memcpy(local_c0,&local_480,0x40);
  }
  else {
    bVar1 = xsimd::none<float,xsimd::avx512bw>((batch_bool<float,_xsimd::avx512bw> *)local_3c2);
    if (bVar1) {
      pbVar2 = (batch *)memcpy(local_c0,local_600,0x40);
    }
    else {
      pbVar2 = xsimd::select<float,xsimd::avx512bw>
                         ((batch_bool<float,_xsimd::avx512bw> *)in_RDI,y,z);
    }
  }
  return pbVar2;
}

Assistant:

batch weight_stadium(PolarExtentCoreContext &ctx,
                         const PositionBatch<batch> &position) const {
      PositionBatch<batch> position_t = position.transform(ctx.flippedBasis);

      PositionBatch<batch> position_t_right = position_t;
      position_t_right.x = xsimd::abs(position_t.x);

      auto circle_test_dot =
          xsimd::fma(position_t_right.x, batch{ctx.circle_test[0]},
                     position_t_right.y * batch{ctx.circle_test[1]});
      auto in_straight_line_part = circle_test_dot >= batch{0.0};

      // for the straight line part
      auto straight_val = weight_from_sin(ctx, xsimd::abs(position_t.z));

      // for the circle part
      auto circle_dot =
          xsimd::fma(position_t_right.x, batch{ctx.right_circle_centre[0]},
                     position_t_right.y * batch{ctx.right_circle_centre[1]});
      auto circle_val = weight_from_cos(ctx, circle_dot);

      if (xsimd::all(in_straight_line_part))
        return straight_val;
      else if (xsimd::none(in_straight_line_part))
        return circle_val;
      else
        return xsimd::select(in_straight_line_part, straight_val, circle_val);
    }